

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tigger_gen.cpp
# Opt level: O3

shared_ptr<tg_program> tigger_gen(shared_ptr<ee_program> *eeprog)

{
  int *piVar1;
  pointer *pptVar2;
  char *pcVar3;
  element_type *peVar4;
  iterator __position;
  ee_funcdef *peVar5;
  int iVar6;
  int iVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  mapped_type *pmVar9;
  undefined8 *puVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  ee_funcdef *eef;
  char *pcVar11;
  shared_ptr<tg_program> sVar12;
  unordered_map<int,_std::optional<int>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>_>
  global_decl_map;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  vector<std::variant<tg_expr_op,_tg_expr_assign_c,_tg_expr_assign_la,_tg_expr_assign_ra,_tg_expr_cond_goto,_tg_expr_goto,_tg_expr_label,_tg_expr_call,_tg_expr_ret,_tg_expr_stack_store,_tg_expr_stack_load,_tg_expr_stack_loadaddr,_tg_expr_global_load,_tg_expr_global_loadaddr>,_std::allocator<std::variant<tg_expr_op,_tg_expr_assign_c,_tg_expr_assign_la,_tg_expr_assign_ra,_tg_expr_cond_goto,_tg_expr_goto,_tg_expr_label,_tg_expr_call,_tg_expr_ret,_tg_expr_stack_store,_tg_expr_stack_load,_tg_expr_stack_loadaddr,_tg_expr_global_load,_tg_expr_global_loadaddr>_>_>
  local_80;
  _Hashtable<int,_std::pair<const_int,_std::optional<int>_>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
  p_Var8->_M_use_count = 1;
  p_Var8->_M_weak_count = 1;
  p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001369f8;
  p_Var8[1]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var8[1]._M_use_count = 0;
  p_Var8[1]._M_weak_count = 0;
  p_Var8[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var8[2]._M_use_count = 0;
  p_Var8[2]._M_weak_count = 0;
  p_Var8[3]._vptr__Sp_counted_base = (_func_int **)0x0;
  p_Var8[3]._M_use_count = 0;
  p_Var8[3]._M_weak_count = 0;
  (eeprog->super___shared_ptr<ee_program,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var8;
  (eeprog->super___shared_ptr<ee_program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)(p_Var8 + 1);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  puVar10 = (undefined8 *)*in_RSI;
  pcVar11 = (char *)*puVar10;
  pcVar3 = (char *)puVar10[1];
  if (pcVar11 != pcVar3) {
    do {
      if (*pcVar11 != 'T') {
        __assert_fail("decl.sym.type == \'T\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/gzz2000[P]Compiler101/tigger_gen.cpp"
                      ,0x2b2,"std::shared_ptr<tg_program> tigger_gen(std::shared_ptr<ee_program>)");
      }
      peVar4 = (eeprog->super___shared_ptr<ee_program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      piVar1 = (int *)(pcVar11 + 4);
      local_a8._0_4_ = *piVar1;
      iVar6 = piVar1[0];
      iVar7 = piVar1[1];
      local_a8._4_4_ = (undefined4)*(undefined8 *)(pcVar11 + 8);
      local_a8._8_4_ = (undefined4)((ulong)*(undefined8 *)(pcVar11 + 8) >> 0x20);
      __position._M_current =
           (((_Vector_base<tg_global_decl,_std::allocator<tg_global_decl>_> *)&peVar4->decls)->
           _M_impl).super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (((_Vector_base<tg_global_decl,_std::allocator<tg_global_decl>_> *)&peVar4->decls)->
          _M_impl).super__Vector_impl_data._M_end_of_storage) {
        std::vector<tg_global_decl,_std::allocator<tg_global_decl>_>::
        _M_realloc_insert<tg_global_decl>
                  ((vector<tg_global_decl,_std::allocator<tg_global_decl>_> *)peVar4,__position,
                   (tg_global_decl *)local_a8);
      }
      else {
        *(undefined4 *)
         &((__position._M_current)->sz).super__Optional_base<int,_true,_true>._M_payload.
          super__Optional_payload_base<int>._M_engaged = local_a8._8_4_;
        (__position._M_current)->vid = iVar6;
        ((__position._M_current)->sz).super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_payload = (_Storage<int,_true>)iVar7;
        pptVar2 = &(((_Vector_base<tg_global_decl,_std::allocator<tg_global_decl>_> *)&peVar4->decls
                    )->_M_impl).super__Vector_impl_data._M_finish;
        *pptVar2 = *pptVar2 + 1;
      }
      pmVar9 = std::__detail::
               _Map_base<int,_std::pair<const_int,_std::optional<int>_>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_std::optional<int>_>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,(key_type *)(pcVar11 + 4));
      (pmVar9->super__Optional_base<int,_true,_true>)._M_payload.super__Optional_payload_base<int> =
           *(_Optional_payload_base<int> *)(pcVar11 + 8);
      pcVar11 = pcVar11 + 0x10;
    } while (pcVar11 != pcVar3);
    puVar10 = (undefined8 *)*in_RSI;
  }
  eef = (ee_funcdef *)puVar10[3];
  peVar5 = (ee_funcdef *)puVar10[4];
  if (eef != peVar5) {
    peVar4 = (eeprog->super___shared_ptr<ee_program,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    do {
      tigger_func_gen((tg_funcdef *)local_a8,eef,
                      (unordered_map<int,_std::optional<int>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>_>
                       *)&local_68);
      std::vector<tg_funcdef,_std::allocator<tg_funcdef>_>::emplace_back<tg_funcdef>
                ((vector<tg_funcdef,_std::allocator<tg_funcdef>_> *)&peVar4->funcdefs,
                 (tg_funcdef *)local_a8);
      std::
      vector<std::variant<tg_expr_op,_tg_expr_assign_c,_tg_expr_assign_la,_tg_expr_assign_ra,_tg_expr_cond_goto,_tg_expr_goto,_tg_expr_label,_tg_expr_call,_tg_expr_ret,_tg_expr_stack_store,_tg_expr_stack_load,_tg_expr_stack_loadaddr,_tg_expr_global_load,_tg_expr_global_loadaddr>,_std::allocator<std::variant<tg_expr_op,_tg_expr_assign_c,_tg_expr_assign_la,_tg_expr_assign_ra,_tg_expr_cond_goto,_tg_expr_goto,_tg_expr_label,_tg_expr_call,_tg_expr_ret,_tg_expr_stack_store,_tg_expr_stack_load,_tg_expr_stack_loadaddr,_tg_expr_global_load,_tg_expr_global_loadaddr>_>_>
      ::~vector(&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_a8._4_4_,local_a8._0_4_) != &local_98) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_a8._4_4_,local_a8._0_4_),
                        local_98._M_allocated_capacity + 1);
      }
      eef = eef + 1;
    } while (eef != peVar5);
  }
  std::
  _Hashtable<int,_std::pair<const_int,_std::optional<int>_>,_std::allocator<std::pair<const_int,_std::optional<int>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  sVar12.super___shared_ptr<tg_program,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar12.super___shared_ptr<tg_program,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)eeprog;
  return (shared_ptr<tg_program>)sVar12.super___shared_ptr<tg_program,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<tg_program> tigger_gen(std::shared_ptr<ee_program> eeprog) {
  std::shared_ptr<tg_program> ret = std::make_shared<tg_program>();
  std::unordered_map<int, std::optional<int>> global_decl_map;
  // decl
  for(const auto &decl: eeprog->decls) {
    assert(decl.sym.type == 'T');
    ret->decls.push_back(tg_global_decl{decl.sym.id, decl.size});
    global_decl_map[decl.sym.id] = decl.size;
  }
  // funcdefs
  for(const auto &funcdef: eeprog->funcdefs) {
    ret->funcdefs.push_back(tigger_func_gen(funcdef, global_decl_map));
  }
  return ret;
}